

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buckets.hpp
# Opt level: O0

void __thiscall
boost::unordered::detail::
node_constructor<std::allocator<boost::unordered::detail::ptr_node<std::pair<const_unsigned_int,_double>_>_>_>
::construct(node_constructor<std::allocator<boost::unordered::detail::ptr_node<std::pair<const_unsigned_int,_double>_>_>_>
            *this)

{
  pointer ppVar1;
  ptr_node<std::pair<const_unsigned_int,_double>_> *p;
  allocator<boost::unordered::detail::ptr_node<std::pair<const_unsigned_int,_double>_>_> *in_RDI;
  size_type in_stack_ffffffffffffffb8;
  pair<const_unsigned_int,_double> *x;
  allocator<boost::unordered::detail::ptr_node<std::pair<const_unsigned_int,_double>_>_>
  *in_stack_ffffffffffffffc0;
  ptr_node<std::pair<const_unsigned_int,_double>_> *v;
  
  if (*(long *)(in_RDI + 8) == 0) {
    in_RDI[0x10] = (allocator<boost::unordered::detail::ptr_node<std::pair<const_unsigned_int,_double>_>_>
                    )0x0;
    in_RDI[0x11] = (allocator<boost::unordered::detail::ptr_node<std::pair<const_unsigned_int,_double>_>_>
                    )0x0;
    ppVar1 = allocator_traits<std::allocator<boost::unordered::detail::ptr_node<std::pair<const_unsigned_int,_double>_>_>_>
             ::allocate(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    *(pointer *)(in_RDI + 8) = ppVar1;
    v = *(ptr_node<std::pair<const_unsigned_int,_double>_> **)in_RDI;
    p = addressof<boost::unordered::detail::ptr_node<std::pair<unsigned_int_const,double>>>(v);
    ptr_node<std::pair<const_unsigned_int,_double>_>::ptr_node(v);
    allocator_traits<std::allocator<boost::unordered::detail::ptr_node<std::pair<unsigned_int_const,double>>>>
    ::
    construct<boost::unordered::detail::ptr_node<std::pair<unsigned_int_const,double>>,boost::unordered::detail::ptr_node<std::pair<unsigned_int_const,double>>>
              (in_RDI,p,v);
    ptr_node<std::pair<const_unsigned_int,_double>_>::init
              (*(ptr_node<std::pair<const_unsigned_int,_double>_> **)(in_RDI + 8),
               *(EVP_PKEY_CTX **)(in_RDI + 8));
    in_RDI[0x10] = (allocator<boost::unordered::detail::ptr_node<std::pair<const_unsigned_int,_double>_>_>
                    )0x1;
  }
  else if (((byte)in_RDI[0x11] & 1) != 0) {
    x = *(pair<const_unsigned_int,_double> **)in_RDI;
    value_base<std::pair<const_unsigned_int,_double>_>::value_ptr
              (*(value_base<std::pair<const_unsigned_int,_double>_> **)(in_RDI + 8));
    func::
    destroy_value_impl<std::allocator<boost::unordered::detail::ptr_node<std::pair<unsigned_int_const,double>>>,std::pair<unsigned_int_const,double>>
              (in_stack_ffffffffffffffc0,x);
    in_RDI[0x11] = (allocator<boost::unordered::detail::ptr_node<std::pair<const_unsigned_int,_double>_>_>
                    )0x0;
  }
  return;
}

Assistant:

void node_constructor<Alloc>::construct()
    {
        if(!node_) {
            node_constructed_ = false;
            value_constructed_ = false;

            node_ = node_allocator_traits::allocate(alloc_, 1);

            node_allocator_traits::construct(alloc_,
                boost::addressof(*node_), node());
            node_->init(node_);
            node_constructed_ = true;
        }
        else {
            BOOST_ASSERT(node_constructed_);

            if (value_constructed_)
            {
                boost::unordered::detail::func::destroy_value_impl(alloc_,
                    node_->value_ptr());
                value_constructed_ = false;
            }
        }
    }